

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
ManySubcommands_Required1Fuzzy_Test::TestBody(ManySubcommands_Required1Fuzzy_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  char *pcVar2;
  App *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  AssertHelper local_180;
  Message local_178;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16c;
  undefined1 local_16b;
  allocator local_16a;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  iterator local_120;
  size_type local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf;
  undefined1 local_be;
  allocator local_bd [20];
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ManySubcommands_Required1Fuzzy_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  CLI::App::require_subcommand(&(this->super_ManySubcommands).super_TApp.app,0,1);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_38,(this->super_ManySubcommands).sub1,false);
  local_be = 1;
  local_a8 = &local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"sub2",&local_a9);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"sub3",local_bd);
  local_be = 0;
  local_60 = &local_a0;
  local_58 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_bf);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l_00,&local_bf);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_20,"sub1->remaining()","vs_t({\"sub2\", \"sub3\"})",&local_38,
             &local_50);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_bf);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_1c0 = local_1c0 + -1;
    std::__cxx11::string::~string((string *)local_1c0);
  } while (local_1c0 != &local_a0);
  std::allocator<char>::~allocator((allocator<char> *)local_bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x2b5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  this_00 = &(this->super_ManySubcommands).super_TApp.app;
  CLI::App::reset(this_00);
  CLI::App::require_subcommand(this_00,-1);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_f8,(this->super_ManySubcommands).sub1,false);
  local_16b = 1;
  local_168 = &local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"sub2",&local_169);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"sub3",&local_16a);
  local_16b = 0;
  local_120 = &local_160;
  local_118 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_16c);
  __l._M_len = local_118;
  __l._M_array = local_120;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l,&local_16c);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_e0,"sub1->remaining()","vs_t({\"sub2\", \"sub3\"})",&local_f8,
             &local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_16c);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120;
  do {
    local_240 = local_240 + -1;
    std::__cxx11::string::~string((string *)local_240);
  } while (local_240 != &local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_16a);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,699,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required1Fuzzy) {

    app.require_subcommand(0, 1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));

    app.reset();
    app.require_subcommand(-1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));
}